

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTagSymbol
          (BinaryReaderIR *this,Index index,uint32_t flags,string_view name,Index tag_index)

{
  Module *pMVar1;
  pointer ppTVar2;
  string_view name_00;
  string *orig_name;
  Enum EVar3;
  size_t in_stack_ffffffffffffff78;
  Tag *pTVar4;
  string dollar_name;
  __buckets_ptr local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  float local_38;
  
  orig_name = (string *)name._M_len;
  EVar3 = Ok;
  if (orig_name != (string *)0x0) {
    pMVar1 = this->module_;
    ppTVar2 = (pMVar1->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)tag_index <
        (ulong)((long)(pMVar1->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3)) {
      pTVar4 = ppTVar2[tag_index];
      name_00._M_str = (char *)pTVar4;
      name_00._M_len = in_stack_ffffffffffffff78;
      (anonymous_namespace)::MakeDollarName_abi_cxx11_(name_00);
      GetUniqueName(&dollar_name,(BinaryReaderIR *)&pMVar1->tag_bindings,(BindingHash *)&local_58,
                    orig_name);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_assign((string *)pTVar4);
      uStack_48 = 0;
      uStack_44 = 0;
      local_58 = (__buckets_ptr)0x0;
      uStack_50 = 0;
      uStack_4c = 0;
      local_38 = (float)tag_index;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)&this->module_->tag_bindings,&dollar_name,&local_58);
      std::__cxx11::string::_M_dispose();
    }
    else {
      PrintError(this,"invalid tag index: %u",(ulong)tag_index,orig_name,name._M_str);
      EVar3 = Error;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderIR::OnTagSymbol(Index index,
                                   uint32_t flags,
                                   std::string_view name,
                                   Index tag_index) {
  if (name.empty()) {
    return Result::Ok;
  }
  if (tag_index >= module_->tags.size()) {
    PrintError("invalid tag index: %" PRIindex, tag_index);
    return Result::Error;
  }
  Tag* tag = module_->tags[tag_index];
  std::string dollar_name =
      GetUniqueName(&module_->tag_bindings, MakeDollarName(name));
  tag->name = dollar_name;
  module_->tag_bindings.emplace(dollar_name, Binding(tag_index));
  return Result::Ok;
}